

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall ON_Layer::PerViewportPersistentVisibility(ON_Layer *this,ON_UUID viewport_id)

{
  bool bVar1;
  ON__LayerPerViewSettings *pOVar2;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  uchar *local_28;
  uchar local_20 [8];
  
  local_20 = viewport_id.Data4;
  local_28 = viewport_id._0_8_;
  if ((((this->m_extension_bits & 1) == 0) && (bVar1 = ON_UuidIsNotNil((ON_UUID *)&local_28), bVar1)
      ) && (viewport_id_00.Data4[0] = '\0', viewport_id_00.Data4[1] = '\0',
           viewport_id_00.Data4[2] = '\0', viewport_id_00.Data4[3] = '\0',
           viewport_id_00.Data4[4] = '\0', viewport_id_00.Data4[5] = '\0',
           viewport_id_00.Data4[6] = '\0', viewport_id_00.Data4[7] = '\0',
           viewport_id_00._0_8_ = local_20,
           pOVar2 = ON__LayerExtensions::ViewportSettings
                              ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                               local_28,viewport_id_00,(bool)in_R9B),
           pOVar2 != (ON__LayerPerViewSettings *)0x0)) {
    if (pOVar2->m_visible == '\x01') {
      return true;
    }
    bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
    if (bVar1) {
      if (pOVar2->m_persistent_visibility == '\x01') {
        return true;
      }
      if (pOVar2->m_persistent_visibility == '\x02') {
        return false;
      }
    }
    if (pOVar2->m_visible == '\x02') {
      return false;
    }
  }
  bVar1 = PersistentVisibility(this);
  return bVar1;
}

Assistant:

bool ON_Layer::PerViewportPersistentVisibility( ON_UUID viewport_id ) const
{
  // added to fix bug 82587
  if ( !ExtensionBit(m_extension_bits,0x01) && ON_UuidIsNotNil(viewport_id) )
  {
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if ( 0 != vp_settings )
    {
      if ( 1 == vp_settings->m_visible )
        return true;
      if ( ParentIdIsNotNil() )
      {
        if ( 1 == vp_settings->m_persistent_visibility )
          return true;
        if ( 2 == vp_settings->m_persistent_visibility )
          return false;
      }
      if ( 2 == vp_settings->m_visible )
        return false;
    }
  }

  return PersistentVisibility();
}